

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

ma_result ma_bpf_process_pcm_frames
                    (ma_bpf *pBPF,void *pFramesOut,void *pFramesIn,ma_uint64 frameCount)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  ma_bpf2 *pmVar15;
  ma_biquad_coefficient *pmVar16;
  ma_result mVar17;
  ulong uVar18;
  long lVar19;
  undefined2 uVar20;
  int iVar21;
  ulong uVar22;
  ulong uVar23;
  int iVar24;
  ma_int16 *pFramesOutS16;
  int iVar25;
  int iVar26;
  float fVar27;
  
  mVar17 = MA_INVALID_ARGS;
  if (pBPF != (ma_bpf *)0x0) {
    if (pFramesOut == pFramesIn) {
      if (pBPF->bpf2Count != 0) {
        lVar19 = 0;
        uVar18 = 0;
        do {
          if (pBPF->pBPF2 == (ma_bpf2 *)0x0) {
            return MA_INVALID_ARGS;
          }
          mVar17 = ma_biquad_process_pcm_frames
                             ((ma_biquad *)((long)&(pBPF->pBPF2->bq).format + lVar19),pFramesOut,
                              pFramesOut,frameCount);
          if (mVar17 != MA_SUCCESS) {
            return mVar17;
          }
          uVar18 = uVar18 + 1;
          lVar19 = lVar19 + 0x40;
        } while (uVar18 < pBPF->bpf2Count);
      }
    }
    else if (pBPF->format == ma_format_f32) {
      if (frameCount != 0) {
        uVar18 = (ulong)pBPF->channels;
        uVar23 = 0;
        do {
          memcpy(pFramesOut,pFramesIn,
                 (ulong)(uint)((int)uVar18 * *(int *)(&DAT_0019a900 + (ulong)pBPF->format * 4)));
          if (pBPF->bpf2Count != 0) {
            uVar18 = 0;
            do {
              pmVar15 = pBPF->pBPF2;
              uVar8 = pmVar15[uVar18].bq.channels;
              fVar1 = pmVar15[uVar18].bq.b0.f32;
              fVar2 = pmVar15[uVar18].bq.b1.f32;
              fVar3 = pmVar15[uVar18].bq.b2.f32;
              fVar4 = pmVar15[uVar18].bq.a1.f32;
              fVar5 = pmVar15[uVar18].bq.a2.f32;
              uVar22 = 0;
              do {
                pmVar16 = pmVar15[uVar18].bq.pR1;
                fVar6 = *(float *)((long)pFramesOut + uVar22 * 4);
                fVar27 = fVar1 * fVar6 + pmVar16[uVar22].f32;
                fVar7 = pmVar15[uVar18].bq.pR2[uVar22].f32;
                *(float *)((long)pFramesOut + uVar22 * 4) = fVar27;
                pmVar16[uVar22].f32 = fVar2 * fVar6 + fVar27 * -fVar4 + fVar7;
                pmVar15[uVar18].bq.pR2[uVar22].f32 = fVar6 * fVar3 + fVar27 * -fVar5;
                uVar22 = uVar22 + 1;
              } while (uVar8 != uVar22);
              uVar18 = uVar18 + 1;
            } while (uVar18 < pBPF->bpf2Count);
          }
          uVar18 = (ulong)pBPF->channels;
          pFramesOut = (void *)((long)pFramesOut + uVar18 * 4);
          pFramesIn = (void *)(uVar18 * 4 + (long)pFramesIn);
          uVar23 = (ulong)((int)uVar23 + 1);
        } while (uVar23 < frameCount);
      }
    }
    else {
      if (pBPF->format != ma_format_s16) {
        return MA_INVALID_OPERATION;
      }
      if (frameCount != 0) {
        uVar23 = (ulong)pBPF->channels;
        uVar18 = 0;
        do {
          memcpy(pFramesOut,pFramesIn,
                 (ulong)(uint)((int)uVar23 * *(int *)(&DAT_0019a900 + (ulong)pBPF->format * 4)));
          if (pBPF->bpf2Count != 0) {
            uVar23 = 0;
            do {
              pmVar15 = pBPF->pBPF2;
              uVar8 = pmVar15[uVar23].bq.channels;
              iVar9 = pmVar15[uVar23].bq.b0.s32;
              iVar10 = pmVar15[uVar23].bq.b1.s32;
              iVar11 = pmVar15[uVar23].bq.b2.s32;
              iVar12 = pmVar15[uVar23].bq.a1.s32;
              iVar13 = pmVar15[uVar23].bq.a2.s32;
              uVar22 = 0;
              do {
                pmVar16 = pmVar15[uVar23].bq.pR1;
                iVar24 = (int)*(short *)((long)pFramesOut + uVar22 * 2);
                iVar14 = pmVar15[uVar23].bq.pR2[uVar22].s32;
                iVar21 = iVar9 * iVar24 + pmVar16[uVar22].s32 >> 0xe;
                iVar25 = iVar12 * iVar21;
                iVar26 = iVar21 * iVar13;
                if (0x7ffe < iVar21) {
                  iVar21 = 0x7fff;
                }
                uVar20 = (undefined2)iVar21;
                if (iVar21 < -0x7fff) {
                  uVar20 = 0x8000;
                }
                *(undefined2 *)((long)pFramesOut + uVar22 * 2) = uVar20;
                pmVar16[uVar22].s32 = (iVar10 * iVar24 + iVar14) - iVar25;
                pmVar15[uVar23].bq.pR2[uVar22].s32 = iVar24 * iVar11 - iVar26;
                uVar22 = uVar22 + 1;
              } while (uVar8 != uVar22);
              uVar23 = uVar23 + 1;
            } while (uVar23 < pBPF->bpf2Count);
          }
          uVar23 = (ulong)pBPF->channels;
          pFramesOut = (void *)((long)pFramesOut + uVar23 * 2);
          pFramesIn = (void *)((long)pFramesIn + uVar23 * 2);
          uVar18 = (ulong)((int)uVar18 + 1);
        } while (uVar18 < frameCount);
      }
    }
    mVar17 = MA_SUCCESS;
  }
  return mVar17;
}

Assistant:

MA_API ma_result ma_bpf_process_pcm_frames(ma_bpf* pBPF, void* pFramesOut, const void* pFramesIn, ma_uint64 frameCount)
{
    ma_result result;
    ma_uint32 ibpf2;

    if (pBPF == NULL) {
        return MA_INVALID_ARGS;
    }

    /* Faster path for in-place. */
    if (pFramesOut == pFramesIn) {
        for (ibpf2 = 0; ibpf2 < pBPF->bpf2Count; ibpf2 += 1) {
            result = ma_bpf2_process_pcm_frames(&pBPF->pBPF2[ibpf2], pFramesOut, pFramesOut, frameCount);
            if (result != MA_SUCCESS) {
                return result;
            }
        }
    }

    /* Slightly slower path for copying. */
    if (pFramesOut != pFramesIn) {
        ma_uint32 iFrame;

        /*  */ if (pBPF->format == ma_format_f32) {
            /* */ float* pFramesOutF32 = (      float*)pFramesOut;
            const float* pFramesInF32  = (const float*)pFramesIn;

            for (iFrame = 0; iFrame < frameCount; iFrame += 1) {
                MA_COPY_MEMORY(pFramesOutF32, pFramesInF32, ma_get_bytes_per_frame(pBPF->format, pBPF->channels));

                for (ibpf2 = 0; ibpf2 < pBPF->bpf2Count; ibpf2 += 1) {
                    ma_bpf2_process_pcm_frame_f32(&pBPF->pBPF2[ibpf2], pFramesOutF32, pFramesOutF32);
                }

                pFramesOutF32 += pBPF->channels;
                pFramesInF32  += pBPF->channels;
            }
        } else if (pBPF->format == ma_format_s16) {
            /* */ ma_int16* pFramesOutS16 = (      ma_int16*)pFramesOut;
            const ma_int16* pFramesInS16  = (const ma_int16*)pFramesIn;

            for (iFrame = 0; iFrame < frameCount; iFrame += 1) {
                MA_COPY_MEMORY(pFramesOutS16, pFramesInS16, ma_get_bytes_per_frame(pBPF->format, pBPF->channels));

                for (ibpf2 = 0; ibpf2 < pBPF->bpf2Count; ibpf2 += 1) {
                    ma_bpf2_process_pcm_frame_s16(&pBPF->pBPF2[ibpf2], pFramesOutS16, pFramesOutS16);
                }

                pFramesOutS16 += pBPF->channels;
                pFramesInS16  += pBPF->channels;
            }
        } else {
            MA_ASSERT(MA_FALSE);
            return MA_INVALID_OPERATION;    /* Should never hit this. */
        }
    }

    return MA_SUCCESS;
}